

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

optional<slang::TimeScaleValue> slang::parseValue(string_view str,size_t *lengthConsumed)

{
  slang *psVar1;
  _Storage<slang::TimeScaleValue,_true> _Var2;
  optional<slang::TimeScaleValue> oVar3;
  _Optional_payload_base<int> _Var4;
  _Optional_payload_base<int> _Var5;
  bool bVar6;
  slang *lengthConsumed_00;
  slang *this;
  int in_R8D;
  _Storage<int,_true> _Var7;
  string_view str_00;
  string_view timeSuffix;
  size_t unitConsumed;
  slang *local_38;
  long local_30;
  
  str_00._M_len = str._M_str;
  this = (slang *)str._M_len;
  lengthConsumed_00 = (slang *)0xa;
  str_00._M_str = (char *)&local_38;
  _Var4 = (_Optional_payload_base<int>)strToInt(this,str_00,(size_t *)0xa,in_R8D);
  _Var5 = _Var4;
  if (((ulong)_Var4 >> 0x20 & 1) != 0) {
    _Var5._1_7_ = _Var4._1_7_;
    _Var5._M_payload._M_value._0_1_ = local_38 < this;
    if (local_38 < this) {
      if (str_00._M_len[(long)local_38] == ' ') {
        do {
          lengthConsumed_00 = local_38 + 1;
          if (this == lengthConsumed_00) goto LAB_001afebd;
          local_38 = lengthConsumed_00;
        } while (str_00._M_len[(long)lengthConsumed_00] == ' ');
        _Var5._M_payload._M_value._0_1_ = lengthConsumed_00 < this;
      }
      psVar1 = local_38;
      if (_Var5._M_payload._0_1_ != '\0') {
        timeSuffix._M_str = (char *)&local_30;
        timeSuffix._M_len = (size_t)(str_00._M_len + (long)local_38);
        _Var5._M_payload._0_2_ =
             suffixToTimeUnit(this + -(long)local_38,timeSuffix,(size_t *)lengthConsumed_00);
        _Var5._2_6_ = 0;
        if (((ushort)_Var5._M_payload._0_2_ >> 8 & 1) != 0) {
          *lengthConsumed = (size_t)(psVar1 + local_30);
          _Var7 = _Var4._M_payload;
          if (_Var7._M_value == 100) {
            _Var2 = (_Storage<slang::TimeScaleValue,_true>)
                    ((ushort)_Var5._M_payload._0_2_ & 0xff | 0x6400);
          }
          else if (_Var7._M_value == 10) {
            _Var2 = (_Storage<slang::TimeScaleValue,_true>)
                    ((ushort)_Var5._M_payload._0_2_ & 0xff | 0xa00);
          }
          else {
            if (_Var7._M_value != 1) goto LAB_001afebd;
            _Var2 = (_Storage<slang::TimeScaleValue,_true>)((ushort)_Var5._M_payload._0_2_ & 0x1ff);
          }
          bVar6 = true;
          goto LAB_001afebf;
        }
      }
    }
  }
LAB_001afebd:
  _Var2 = _Var5._M_payload._0_2_;
  bVar6 = false;
LAB_001afebf:
  oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScaleValue>._M_engaged = bVar6;
  oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScaleValue>._M_payload = _Var2;
  return (optional<slang::TimeScaleValue>)
         oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
         super__Optional_payload_base<slang::TimeScaleValue>;
}

Assistant:

static std::optional<TimeScaleValue> parseValue(std::string_view str, size_t& lengthConsumed) {
    size_t idx;
    auto i = strToInt(str, &idx);
    if (!i)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size())
        return {};

    size_t unitConsumed;
    auto unit = suffixToTimeUnit(str.substr(idx), unitConsumed);
    if (!unit)
        return {};

    lengthConsumed = idx + unitConsumed;
    return TimeScaleValue::fromLiteral(double(*i), *unit);
}